

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglResizeTests.cpp
# Opt level: O1

IvVec2 * deqp::egl::ivVec2(IvVec2 *__return_storage_ptr__,IVec2 *vec)

{
  int iVar1;
  int iVar2;
  long lVar3;
  
  iVar1 = vec->m_data[0];
  iVar2 = vec->m_data[1];
  lVar3 = 0x10;
  do {
    *(undefined1 *)((long)__return_storage_ptr__->m_data + lVar3 + -0x10) = 0;
    *(undefined8 *)((long)__return_storage_ptr__->m_data + lVar3 + -8) = 0x7ff0000000000000;
    *(undefined8 *)(&__return_storage_ptr__->m_data[0].m_hasNaN + lVar3) = 0xfff0000000000000;
    lVar3 = lVar3 + 0x18;
  } while (lVar3 != 0x40);
  __return_storage_ptr__->m_data[0].m_hasNaN = false;
  __return_storage_ptr__->m_data[0].m_lo = (double)iVar1;
  __return_storage_ptr__->m_data[0].m_hi = (double)iVar1;
  __return_storage_ptr__->m_data[1].m_hasNaN = false;
  __return_storage_ptr__->m_data[1].m_lo = (double)iVar2;
  __return_storage_ptr__->m_data[1].m_hi = (double)iVar2;
  return __return_storage_ptr__;
}

Assistant:

IvVec2 ivVec2 (const IVec2& vec)
{
	return IvVec2(double(vec.x()), double(vec.y()));
}